

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O3

void set_malign(monst *mtmp)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int absmal;
  uint uVar4;
  uint uVar5;
  uint n;
  aligntyp aVar6;
  bool bVar7;
  
  aVar6 = mtmp->data->maligntyp;
  bVar7 = (*(uint *)&mtmp->field_0x60 & 0x14000000) != 0;
  if (bVar7) {
    if (bVar7) {
      aVar6 = mtmp->field_0x74;
    }
    aVar6 = aVar6 * '\x05';
  }
  n = (uint)aVar6;
  iVar2 = sgn(n);
  iVar3 = sgn((int)u.ualign.type);
  if (mtmp->data->msound == '\x1f') {
    mtmp->malign = -0x14;
    return;
  }
  uVar4 = mtmp->data->mflags2;
  if ((uVar4 >> 0x15 & 1) == 0) {
    if ((uVar4 >> 0x14 & 1) == 0) {
      uVar5 = -n;
      if (0 < (int)n) {
        uVar5 = n;
      }
      if (iVar2 == iVar3) {
        cVar1 = '\x03';
        if (3 < uVar5) {
          cVar1 = (char)uVar5;
        }
        if ((mtmp->field_0x62 & 0x40) != 0) goto LAB_001bc18a;
        goto LAB_001bc192;
      }
    }
    else {
      if (iVar2 == iVar3) {
        mtmp->malign = '\0';
        return;
      }
      uVar4 = -n;
      if (0 < (int)n) {
        uVar4 = n;
      }
      uVar5 = 5;
      if (5 < uVar4) {
        uVar5 = uVar4;
      }
    }
    mtmp->malign = (aligntyp)uVar5;
  }
  else {
    uVar4 = -n;
    if (0 < (int)n) {
      uVar4 = n;
    }
    cVar1 = '\x05';
    if (5 < uVar4) {
      cVar1 = (char)uVar4;
    }
    if ((mtmp->field_0x62 & 0x40) == 0) {
      cVar1 = cVar1 * '\x03';
    }
    else {
LAB_001bc18a:
      cVar1 = cVar1 * -3;
    }
LAB_001bc192:
    mtmp->malign = cVar1;
  }
  return;
}

Assistant:

void set_malign(struct monst *mtmp)
{
	schar mal = mtmp->data->maligntyp;
	boolean coaligned;

	if (mtmp->ispriest || mtmp->isminion) {
		/* some monsters have individual alignments; check them */
		if (mtmp->ispriest)
			mal = EPRI(mtmp)->shralign;
		else if (mtmp->isminion)
			mal = EMIN(mtmp)->min_align;
		/* unless alignment is none, set mal to -5,0,5 */
		/* (see align.h for valid aligntyp values)     */
		if (mal != A_NONE)
			mal *= 5;
	}

	coaligned = (sgn(mal) == sgn(u.ualign.type));
	if (mtmp->data->msound == MS_LEADER) {
		mtmp->malign = -20;
	} else if (mal == A_NONE) {
		if (mtmp->mpeaceful)
			mtmp->malign = 0;
		else
			mtmp->malign = 20;	/* really hostile */
	} else if (always_peaceful(mtmp->data)) {
		int absmal = abs(mal);
		if (mtmp->mpeaceful)
			mtmp->malign = -3*max(5,absmal);
		else
			mtmp->malign = 3*max(5,absmal); /* renegade */
	} else if (always_hostile(mtmp->data)) {
		int absmal = abs(mal);
		if (coaligned)
			mtmp->malign = 0;
		else
			mtmp->malign = max(5,absmal);
	} else if (coaligned) {
		int absmal = abs(mal);
		if (mtmp->mpeaceful)
			mtmp->malign = -3*max(3,absmal);
		else	/* renegade */
			mtmp->malign = max(3,absmal);
	} else	/* not coaligned and therefore hostile */
		mtmp->malign = abs(mal);
}